

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall UtestShellPointerArray::shuffle(UtestShellPointerArray *this,size_t seed)

{
  UtestShell **ppUVar1;
  UtestShell *pUVar2;
  long *plVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  if (this->count_ != 0) {
    (*PlatformSpecificSrand)((uint)seed);
    uVar6 = this->count_;
    uVar7 = uVar6;
    if (uVar6 == 1) {
      uVar6 = 1;
    }
    else {
      do {
        if (uVar6 == 0) {
          return;
        }
        iVar4 = (*PlatformSpecificRand)();
        ppUVar1 = this->arrayOfTests_;
        pUVar2 = ppUVar1[uVar7 - 1];
        ppUVar1[uVar7 - 1] = ppUVar1[(ulong)(long)iVar4 % uVar7];
        this->arrayOfTests_[(ulong)(long)iVar4 % uVar7] = pUVar2;
        uVar6 = this->count_;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 1);
      if (uVar6 == 0) {
        return;
      }
    }
    lVar8 = -8;
    uVar7 = 0;
    uVar5 = 0;
    do {
      plVar3 = *(long **)((long)this->arrayOfTests_ + lVar8 + uVar6 * 8);
      uVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,uVar5);
      uVar7 = uVar7 + 1;
      uVar6 = this->count_;
      lVar8 = lVar8 + -8;
    } while (uVar7 < uVar6);
  }
  return;
}

Assistant:

void UtestShellPointerArray::shuffle(size_t seed)
{
    if (count_ == 0) return;

    PlatformSpecificSrand((unsigned int) seed);

    for (size_t i = count_ - 1; i >= 1; --i)
    {
        if (count_ == 0) return;

        const size_t j = ((size_t)PlatformSpecificRand()) % (i + 1); // distribution biased by modulo, but good enough for shuffling
        swap(i, j);
   }
   relinkTestsInOrder();
}